

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

int32 dumb_it_build_checkpoints(DUMB_IT_SIGDATA *sigdata,int startorder)

{
  int iVar1;
  IT_CALLBACKS *pIVar2;
  IT_CHECKPOINT *pIVar3;
  bool bVar4;
  int32 iVar5;
  IT_CHECKPOINT *pIVar6;
  DUMB_IT_SIGRENDERER *pDVar7;
  IT_CHECKPOINT *pIVar8;
  int32 iVar9;
  
  iVar9 = 0;
  if (sigdata != (DUMB_IT_SIGDATA *)0x0) {
    pIVar6 = sigdata->checkpoint;
    while (pIVar6 != (IT_CHECKPOINT *)0x0) {
      pIVar8 = pIVar6->next;
      _dumb_it_end_sigrenderer(pIVar6->sigrenderer);
      free(pIVar6);
      pIVar6 = pIVar8;
    }
    sigdata->checkpoint = (IT_CHECKPOINT *)0x0;
    pIVar6 = (IT_CHECKPOINT *)malloc(0x18);
    iVar9 = 0;
    if (pIVar6 != (IT_CHECKPOINT *)0x0) {
      pIVar6->time = 0;
      iVar9 = 0;
      pDVar7 = dumb_it_init_sigrenderer(sigdata,0,startorder);
      pIVar6->sigrenderer = pDVar7;
      if (pDVar7 == (DUMB_IT_SIGRENDERER *)0x0) {
        free(pIVar6);
      }
      else {
        pIVar2 = pDVar7->callbacks;
        pIVar2->loop = dumb_it_callback_terminate;
        pIVar2->xm_speed_zero = dumb_it_callback_terminate;
        pIVar2->global_volume_zero = dumb_it_callback_terminate;
        pIVar8 = sigdata->checkpoint;
        while (pIVar8 != (IT_CHECKPOINT *)0x0) {
          pIVar3 = pIVar8->next;
          _dumb_it_end_sigrenderer(pIVar8->sigrenderer);
          free(pIVar8);
          pIVar8 = pIVar3;
        }
        sigdata->checkpoint = pIVar6;
        iVar9 = 0;
        do {
          pDVar7 = dup_sigrenderer(pIVar6->sigrenderer,0,pIVar6->sigrenderer->callbacks);
          pIVar6->sigrenderer->callbacks = (IT_CALLBACKS *)0x0;
          if (pDVar7 == (DUMB_IT_SIGRENDERER *)0x0) {
            pIVar6->next = (IT_CHECKPOINT *)0x0;
            iVar9 = pIVar6->time;
LAB_005b143a:
            bVar4 = false;
            pIVar8 = pIVar6;
          }
          else {
            iVar5 = it_sigrenderer_get_samples(pDVar7,0.0,1.0,0x1e0000,(sample_t_conflict **)0x0);
            if (iVar5 < 0x1e0000) {
              _dumb_it_end_sigrenderer(pDVar7);
              pIVar6->next = (IT_CHECKPOINT *)0x0;
              iVar9 = iVar5 + pIVar6->time;
              bVar4 = false;
              pIVar8 = pIVar6;
            }
            else {
              pIVar8 = (IT_CHECKPOINT *)malloc(0x18);
              pIVar6->next = pIVar8;
              if (pIVar8 == (IT_CHECKPOINT *)0x0) {
                _dumb_it_end_sigrenderer(pDVar7);
                iVar9 = pIVar6->time + 0x1e0000;
                goto LAB_005b143a;
              }
              iVar1 = pIVar6->time;
              pIVar8->time = iVar1 + 0x1e0000;
              pIVar8->sigrenderer = pDVar7;
              bVar4 = true;
              if (0x1c01ffff < iVar1) {
                pIVar8->next = (IT_CHECKPOINT *)0x0;
                bVar4 = false;
                iVar9 = 0;
              }
            }
          }
          pIVar6 = pIVar8;
        } while (bVar4);
      }
    }
  }
  return iVar9;
}

Assistant:

int32 DUMBEXPORT dumb_it_build_checkpoints(DUMB_IT_SIGDATA *sigdata, int startorder)
{
	IT_CHECKPOINT *checkpoint;
	if (!sigdata) return 0;
	checkpoint = sigdata->checkpoint;
	while (checkpoint) {
		IT_CHECKPOINT *next = checkpoint->next;
		_dumb_it_end_sigrenderer(checkpoint->sigrenderer);
		free(checkpoint);
		checkpoint = next;
	}
	sigdata->checkpoint = NULL;
	checkpoint = malloc(sizeof(*checkpoint));
	if (!checkpoint) return 0;
	checkpoint->time = 0;
	checkpoint->sigrenderer = dumb_it_init_sigrenderer(sigdata, 0, startorder);
	if (!checkpoint->sigrenderer) {
		free(checkpoint);
		return 0;
	}
	checkpoint->sigrenderer->callbacks->loop = &dumb_it_callback_terminate;
	checkpoint->sigrenderer->callbacks->xm_speed_zero = &dumb_it_callback_terminate;
	checkpoint->sigrenderer->callbacks->global_volume_zero = &dumb_it_callback_terminate;

	if (sigdata->checkpoint)
	{
		IT_CHECKPOINT *checkpoint = sigdata->checkpoint;
		while (checkpoint) {
			IT_CHECKPOINT *next = checkpoint->next;
			_dumb_it_end_sigrenderer(checkpoint->sigrenderer);
			free(checkpoint);
			checkpoint = next;
		}
	}

	sigdata->checkpoint = checkpoint;

	for (;;) {
		int32 l;
		DUMB_IT_SIGRENDERER *sigrenderer = dup_sigrenderer(checkpoint->sigrenderer, 0, checkpoint->sigrenderer->callbacks);
		checkpoint->sigrenderer->callbacks = NULL;
		if (!sigrenderer) {
			checkpoint->next = NULL;
			return checkpoint->time;
		}

		l = it_sigrenderer_get_samples(sigrenderer, 0, 1.0f, IT_CHECKPOINT_INTERVAL, NULL);
		if (l < IT_CHECKPOINT_INTERVAL) {
			_dumb_it_end_sigrenderer(sigrenderer);
			checkpoint->next = NULL;
			return checkpoint->time + l;
		}

		checkpoint->next = malloc(sizeof(*checkpoint->next));
		if (!checkpoint->next) {
			_dumb_it_end_sigrenderer(sigrenderer);
			return checkpoint->time + IT_CHECKPOINT_INTERVAL;
		}

		checkpoint->next->time = checkpoint->time + IT_CHECKPOINT_INTERVAL;
		checkpoint = checkpoint->next;
		checkpoint->sigrenderer = sigrenderer;

		if (checkpoint->time >= FUCKIT_THRESHOLD) {
			checkpoint->next = NULL;
			return 0;
		}
	}
}